

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChFrameMoving<double>::PointSpeedParentToLocal
          (ChVector<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChVector<double> *parentpos,ChVector<double> *parentspeed)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ChVector<double> localpos;
  double local_38;
  ulong local_30;
  ulong local_28;
  
  ChTransform<double>::TransformParentToLocal
            (parentpos,&(this->super_ChFrame<double>).coord.pos,
             &(this->super_ChFrame<double>).Amatrix);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_38;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_30;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_28;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (this->coord_dt).rot.m_data[0];
  dVar1 = (this->coord_dt).rot.m_data[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_38 * dVar1;
  auVar5 = vfmsub231sd_fma(auVar27,auVar23,ZEXT816(0) << 0x40);
  dVar2 = (this->coord_dt).rot.m_data[2];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2;
  auVar5 = vfnmadd231sd_fma(auVar5,auVar29,auVar18);
  dVar3 = (this->coord_dt).rot.m_data[3];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar3;
  auVar6 = vfnmadd231sd_fma(auVar5,auVar31,auVar21);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 * 0.0;
  auVar5 = vfmadd231sd_fma(auVar32,auVar23,auVar15);
  auVar5 = vfnmadd231sd_fma(auVar5,auVar31,auVar18);
  auVar5 = vfmadd231sd_fma(auVar5,auVar29,auVar21);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar2 * 0.0;
  auVar4 = vfmadd231sd_fma(auVar33,auVar23,auVar18);
  auVar4 = vfmadd231sd_fma(auVar4,auVar31,auVar15);
  auVar7 = vfnmadd231sd_fma(auVar4,auVar25,auVar21);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar3 * 0.0;
  auVar4 = vfmadd231sd_fma(auVar28,auVar23,auVar21);
  auVar4 = vfnmadd231sd_fma(auVar4,auVar29,auVar15);
  auVar4 = vfmadd231sd_fma(auVar4,auVar25,auVar18);
  dVar1 = (this->super_ChFrame<double>).coord.rot.m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[2];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (this->super_ChFrame<double>).coord.rot.m_data[3];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar5._0_8_ * dVar1;
  auVar8 = vfnmadd231sd_fma(auVar26,auVar6,auVar19);
  auVar8 = vfmadd231sd_fma(auVar8,auVar4,auVar22);
  auVar9 = vfnmadd231sd_fma(auVar8,auVar7,auVar24);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar7._0_8_ * dVar1;
  auVar8 = vfnmadd231sd_fma(auVar30,auVar6,auVar22);
  auVar8 = vfnmadd231sd_fma(auVar8,auVar4,auVar19);
  auVar8 = vfmadd231sd_fma(auVar8,auVar5,auVar24);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar4._0_8_ * dVar1;
  auVar4 = vfnmadd231sd_fma(auVar16,auVar24,auVar6);
  auVar4 = vfmadd231sd_fma(auVar4,auVar19,auVar7);
  auVar5 = vfnmadd231sd_fma(auVar4,auVar22,auVar5);
  dVar1 = (parentspeed->m_data[0] - (this->coord_dt).pos.m_data[0]) - (auVar9._0_8_ + auVar9._0_8_);
  dVar2 = (parentspeed->m_data[1] - (this->coord_dt).pos.m_data[1]) - (auVar8._0_8_ + auVar8._0_8_);
  dVar3 = (parentspeed->m_data[2] - (this->coord_dt).pos.m_data[2]) - (auVar5._0_8_ + auVar5._0_8_);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       dVar2 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x18);
  auVar5 = vfmadd231sd_fma(auVar17,auVar13,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x30);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3;
  auVar5 = vfmadd231sd_fma(auVar5,auVar11,auVar4);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 8);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       dVar2 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x20);
  auVar4 = vfmadd231sd_fma(auVar20,auVar13,auVar8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x38);
  auVar4 = vfmadd231sd_fma(auVar4,auVar11,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       dVar2 * *(double *)
                ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array + 0x28);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar8 = vfmadd231sd_fma(auVar10,auVar14,auVar7);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(this->super_ChFrame<double>).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x40);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3;
  auVar8 = vfmadd231sd_fma(auVar8,auVar12,auVar9);
  __return_storage_ptr__->m_data[0] = auVar5._0_8_;
  __return_storage_ptr__->m_data[1] = auVar4._0_8_;
  __return_storage_ptr__->m_data[2] = auVar8._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> PointSpeedParentToLocal(const ChVector<Real>& parentpos, const ChVector<Real>& parentspeed) const {
        ChVector<Real> localpos = ChFrame<Real>::TransformParentToLocal(parentpos);
        return this->Amatrix.transpose() *
               (parentspeed - coord_dt.pos -
                ((coord_dt.rot % ChQuaternion<Real>(0, localpos) % this->coord.rot.GetConjugate()).GetVector() * 2));
    }